

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portability_path_test.cpp
# Opt level: O2

void __thiscall
portability_path_test_portability_path_test_join_right_empty_Test::
portability_path_test_portability_path_test_join_right_empty_Test
          (portability_path_test_portability_path_test_join_right_empty_Test *this)

{
  portability_path_test::portability_path_test(&this->super_portability_path_test);
  (this->super_portability_path_test).super_Test._vptr_Test = (_func_int **)&PTR__Test_00156768;
  return;
}

Assistant:

TEST_F(portability_path_test, portability_path_test_join_right_empty)
{
	static const char left[] = "/a/b/c/";
	static const char right[] = "";
	static const char result[] = "/a/b/c/";

	string_path join;

	size_t size = portability_path_join(left, sizeof(left), right, sizeof(right), join, PATH_SIZE);

	EXPECT_EQ((int)0, (int)strcmp(join, result));
	EXPECT_EQ((size_t)size, (size_t)sizeof(result));
	EXPECT_EQ((char)'\0', (char)result[size - 1]);
}